

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O2

void __thiscall
PointerBasedIterator_TotalOrder_Test::~PointerBasedIterator_TotalOrder_Test
          (PointerBasedIterator_TotalOrder_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (PointerBasedIterator, TotalOrder) {
    std::array<int, 2> arr{{1, 3}};
    iterator b{&arr[0] + 2};
    iterator a{&arr[0]};
    EXPECT_TRUE (b > a);
    EXPECT_TRUE (b >= a);
    EXPECT_FALSE (b < a);
    EXPECT_FALSE (b <= a);
    EXPECT_FALSE (b == a);
    EXPECT_TRUE (b != a);

    // Comparing const- and non-const iterators.
    const_iterator c{&arr[0]};
    EXPECT_TRUE (b > c);
    EXPECT_TRUE (b >= c);
    EXPECT_FALSE (b < c);
    EXPECT_FALSE (b <= c);
    EXPECT_FALSE (b == c);
    EXPECT_TRUE (b != c);
}